

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

double __thiscall
HEkkDual::computeExactDualObjectiveValue(HEkkDual *this,HVector *dual_col,HVector *dual_row)

{
  double dVar1;
  HighsInt size_;
  HEkk *pHVar2;
  pointer piVar3;
  pointer piVar4;
  bool bVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  pointer pdVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double local_c8;
  double local_c0;
  double local_b8;
  double dStack_b0;
  double local_80;
  
  pHVar2 = this->ekk_instance_;
  HVectorBase<double>::setup(dual_col,(pHVar2->lp_).num_row_);
  HVectorBase<double>::clear(dual_col);
  iVar8 = (pHVar2->lp_).num_row_;
  if (0 < iVar8) {
    piVar3 = (pHVar2->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (dual_col->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (dual_col->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      iVar8 = piVar3[lVar11];
      if (iVar8 < (pHVar2->lp_).num_col_) {
        dVar15 = (pHVar2->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start[iVar8];
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
          pdVar9[lVar11] = dVar15;
          iVar8 = dual_col->count;
          dual_col->count = iVar8 + 1;
          piVar4[iVar8] = (int)lVar11;
        }
      }
      lVar11 = lVar11 + 1;
      iVar8 = (pHVar2->lp_).num_row_;
    } while (lVar11 < iVar8);
  }
  size_ = (pHVar2->lp_).num_col_;
  HVectorBase<double>::setup(dual_row,size_);
  HVectorBase<double>::clear(dual_row);
  if (dual_col->count != 0) {
    HSimplexNla::btran(this->simplex_nla,dual_col,1.0,(HighsTimerClock *)0x0);
    HighsSparseMatrix::priceByColumn(&(pHVar2->lp_).a_matrix_,false,dual_row,dual_col,-2);
  }
  HEkk::computeSimplexDualInfeasible(this->ekk_instance_);
  if (0 < (pHVar2->info_).num_dual_infeasibilities) {
    highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kInfo,
                "When computing exact dual objective, the unperturbed costs yield num / max / sum dual infeasibilities = %d / %g / %g\n"
                ,(pHVar2->info_).max_dual_infeasibility,(pHVar2->info_).sum_dual_infeasibilities);
  }
  local_c0 = (pHVar2->lp_).offset_;
  iVar10 = (pHVar2->lp_).num_col_;
  bVar5 = 0 < iVar10;
  if (iVar10 < 1) {
    local_b8 = 0.0;
    dStack_b0 = 0.0;
    local_c8 = 0.0;
  }
  else {
    local_b8 = 0.0;
    dStack_b0 = 0.0;
    local_c8 = 0.0;
    uVar13 = 0;
    do {
      if ((pHVar2->basis_).nonbasicFlag_.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar13] != '\0') {
        dVar14 = (pHVar2->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar13] -
                 (dual_row->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13];
        dVar15 = (this->ekk_instance_->options_->super_HighsOptionsStruct).small_matrix_value;
        lVar11 = 0x21d0;
        if (-dVar15 <= dVar14) {
          lVar11 = 0x25f0;
        }
        if (dVar15 < dVar14) {
          lVar11 = 0x21b8;
        }
        dVar15 = *(double *)(*(long *)((long)&pHVar2->callback_ + lVar11) + uVar13 * 8);
        bVar7 = highs_isInfinity(ABS(dVar15));
        if (!bVar7) {
          dVar1 = (pHVar2->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar13];
          dVar6 = ABS(dVar14 - dVar1);
          if (10000000000.0 < dVar6) {
            highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,
                        kWarning,
                        "Col %4d: ExactDual = %11.4g; WorkDual = %11.4g; Residual = %11.4g\n",dVar14
                        ,dVar1,SUB84(dVar6,0),uVar13 & 0xffffffff);
          }
          local_b8 = local_b8 + dVar6;
          dStack_b0 = dStack_b0 + ABS(dVar14);
          dVar14 = dVar14 * dVar15;
          dVar15 = local_c0 + dVar14;
          local_c8 = local_c8 +
                     (local_c0 - (dVar15 - dVar14)) + (dVar14 - (dVar15 - (dVar15 - dVar14)));
          local_c0 = dVar15;
        }
        if (bVar7) break;
      }
      uVar13 = uVar13 + 1;
      lVar11 = (long)(pHVar2->lp_).num_col_;
      bVar5 = (long)uVar13 < lVar11;
    } while ((long)uVar13 < lVar11);
  }
  local_80 = -INFINITY;
  if (!bVar5) {
    iVar8 = size_ + iVar8;
    iVar10 = (pHVar2->lp_).num_col_;
    bVar5 = iVar10 < iVar8;
    if (iVar10 < iVar8) {
      lVar11 = (long)iVar10;
      do {
        if ((pHVar2->basis_).nonbasicFlag_.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] != '\0') {
          uVar12 = iVar10 - (pHVar2->lp_).num_col_;
          dVar15 = (dual_col->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar12];
          dVar14 = (this->ekk_instance_->options_->super_HighsOptionsStruct).small_matrix_value;
          if (dVar15 <= dVar14) {
            if (dVar15 < -dVar14) {
              pdVar9 = (pHVar2->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              goto LAB_0035462a;
            }
            dVar14 = -(pHVar2->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar11];
          }
          else {
            pdVar9 = (pHVar2->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
LAB_0035462a:
            dVar14 = pdVar9[(int)uVar12];
          }
          bVar7 = highs_isInfinity(ABS(dVar14));
          if (!bVar7) {
            dVar1 = (pHVar2->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar11];
            dVar6 = ABS(dVar15 + dVar1);
            if (10000000000.0 < dVar6) {
              highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,
                          kWarning,
                          "Row %4d: ExactDual = %11.4g; WorkDual = %11.4g; Residual = %11.4g\n",
                          dVar15,dVar1,SUB84(dVar6,0),(ulong)uVar12);
            }
            local_b8 = local_b8 + dVar6;
            dStack_b0 = dStack_b0 + ABS(dVar15);
            dVar15 = dVar15 * dVar14;
            dVar14 = local_c0 + dVar15;
            local_c8 = local_c8 +
                       (local_c0 - (dVar14 - dVar15)) + (dVar15 - (dVar14 - (dVar14 - dVar15)));
            local_c0 = dVar14;
          }
          if (bVar7) break;
        }
        bVar5 = lVar11 + 1 < (long)iVar8;
        iVar10 = iVar10 + 1;
        lVar11 = lVar11 + 1;
      } while (iVar8 != iVar10);
    }
    if (!bVar5) {
      dVar15 = 1.0;
      if (1.0 <= dStack_b0) {
        dVar15 = dStack_b0;
      }
      if (0.001 < local_b8 / dVar15) {
        highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kWarning,
                    "||exact dual vector|| = %g; ||delta dual vector|| = %g: ratio = %g\n");
      }
      local_80 = local_c0 + local_c8;
    }
  }
  return local_80;
}

Assistant:

double HEkkDual::computeExactDualObjectiveValue(HVector& dual_col,
                                                HVector& dual_row) {
  const HighsLp& lp = ekk_instance_.lp_;
  const SimplexBasis& basis = ekk_instance_.basis_;
  const HighsSimplexInfo& info = ekk_instance_.info_;
  // Create a local buffer for the pi vector
  dual_col.setup(lp.num_row_);
  dual_col.clear();
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    HighsInt iVar = basis.basicIndex_[iRow];
    if (iVar < lp.num_col_) {
      const double value = lp.col_cost_[iVar];
      if (value) {
        dual_col.array[iRow] = value;
        dual_col.index[dual_col.count++] = iRow;
      }
    }
  }
  // Create a local buffer for the dual vector
  const HighsInt numTot = lp.num_col_ + lp.num_row_;
  dual_row.setup(lp.num_col_);
  dual_row.clear();
  if (dual_col.count) {
    const bool quad_precision = false;
    const double expected_density = 1;
    simplex_nla->btran(dual_col, expected_density);
    lp.a_matrix_.priceByColumn(quad_precision, dual_row, dual_col);
  }
  // Compute dual infeasibilities
  ekk_instance_.computeSimplexDualInfeasible();
  if (info.num_dual_infeasibilities > 0)
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "When computing exact dual objective, the unperturbed costs "
                "yield num / max / sum dual "
                "infeasibilities = %d / %g / %g\n",
                (int)info.num_dual_infeasibilities, info.max_dual_infeasibility,
                info.sum_dual_infeasibilities);
  HighsCDouble dual_objective = lp.offset_;
  double norm_dual = 0;
  double norm_delta_dual = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (!basis.nonbasicFlag_[iCol]) continue;
    double exact_dual = lp.col_cost_[iCol] - dual_row.array[iCol];
    // The active value must be decided based on the exact dual. For a nonbasic
    // column the bound that must be used may flip due to cost perturbation
    // flipping the sign of its dual and for a basic variable we may need to add
    // to the dual objective using one of the bounds when its dual is not zero.
    double active_value;
    if (exact_dual > ekk_instance_.options_->small_matrix_value)
      active_value = lp.col_lower_[iCol];
    else if (exact_dual < -ekk_instance_.options_->small_matrix_value)
      active_value = lp.col_upper_[iCol];
    else
      active_value = info.workValue_[iCol];

    // when the active value is infinite the dual objective lower bound is
    // -infinity
    if (highs_isInfinity(fabs(active_value))) return -kHighsInf;

    double residual = fabs(exact_dual - info.workDual_[iCol]);
    norm_dual += fabs(exact_dual);
    norm_delta_dual += residual;
    if (residual > 1e10)
      highsLogDev(
          ekk_instance_.options_->log_options, HighsLogType::kWarning,
          "Col %4" HIGHSINT_FORMAT
          ": ExactDual = %11.4g; WorkDual = %11.4g; Residual = %11.4g\n",
          iCol, exact_dual, info.workDual_[iCol], residual);
    dual_objective += active_value * exact_dual;
  }

  for (HighsInt iVar = lp.num_col_; iVar < numTot; iVar++) {
    if (!basis.nonbasicFlag_[iVar]) continue;
    HighsInt iRow = iVar - lp.num_col_;
    double exact_dual = dual_col.array[iRow];
    // Similarly to the column case above the active value must be decided based
    // on the exact dual. For a nonbasic row the bound that must be used
    // may flip due to cost perturbation flipping the sign of its dual and for a
    // basic variable we may need to add to the dual objective using one of the
    // bounds when its dual is not zero.
    double active_value;
    if (exact_dual > ekk_instance_.options_->small_matrix_value)
      active_value = lp.row_lower_[iRow];
    else if (exact_dual < -ekk_instance_.options_->small_matrix_value)
      active_value = lp.row_upper_[iRow];
    else
      active_value = -info.workValue_[iVar];

    // when the active value is infinite the dual objective lower bound is
    // -infinity
    if (highs_isInfinity(fabs(active_value))) return -kHighsInf;

    double residual = fabs(exact_dual + info.workDual_[iVar]);
    norm_dual += fabs(exact_dual);
    norm_delta_dual += residual;
    if (residual > 1e10)
      highsLogDev(
          ekk_instance_.options_->log_options, HighsLogType::kWarning,
          "Row %4" HIGHSINT_FORMAT
          ": ExactDual = %11.4g; WorkDual = %11.4g; Residual = %11.4g\n",
          iRow, exact_dual, info.workDual_[iVar], residual);
    dual_objective += active_value * exact_dual;
  }
  double relative_delta = norm_delta_dual / std::max(norm_dual, 1.0);
  if (relative_delta > 1e-3)
    highsLogDev(
        ekk_instance_.options_->log_options, HighsLogType::kWarning,
        "||exact dual vector|| = %g; ||delta dual vector|| = %g: ratio = %g\n",
        norm_dual, norm_delta_dual, relative_delta);
  return double(dual_objective);
}